

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

iterator * __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::end
          (iterator *__return_storage_ptr__,
          IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
          *this)

{
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> local_90;
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
  *local_18;
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
  *this_local;
  
  local_18 = this;
  this_local = (IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
                *)__return_storage_ptr__;
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::GroupByState
            (&local_90,&this->source);
  iterator::iterator(__return_storage_ptr__,&local_90,false);
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::~GroupByState(&local_90);
  return __return_storage_ptr__;
}

Assistant:

iterator end() { return iterator(source, false); }